

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_typetraits.cpp
# Opt level: O2

void __thiscall
MxxExperimentalTypeTraits_typed_static_function_Test::
MxxExperimentalTypeTraits_typed_static_function_Test
          (MxxExperimentalTypeTraits_typed_static_function_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0012ffa8;
  return;
}

Assistant:

TEST(MxxExperimentalTypeTraits, typed_static_function) {
    // classes with static function void()
    EXPECT_TRUE((has_static_member_function_test_member<static_func, void()>::value));
    EXPECT_TRUE((has_static_member_function_test_member<multiple_static_funcs, void()>::value));
    EXPECT_TRUE((has_static_member_function_test_member<multi_mixed_funcs,void()>::value));

    // classes without static function void()
    EXPECT_FALSE((has_static_member_function_test_member<static_obj,void()>::value));
    EXPECT_FALSE((has_static_member_function_test_member<static_const_obj,void()>::value));
    EXPECT_FALSE((has_static_member_function_test_member<static_constexpr_obj,void()>::value));
    EXPECT_FALSE((has_static_member_function_test_member<no_member,void()>::value));
    EXPECT_FALSE((has_static_member_function_test_member<nonstatic_obj,void()>::value));
    EXPECT_FALSE((has_static_member_function_test_member<nonstatic_func,void()>::value));
    EXPECT_FALSE((has_static_member_function_test_member<multiple_funcs,void()>::value));
}